

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::defaultCollisionHandler(btSoftBody *this,btSoftBody *psb)

{
  uint uVar1;
  btCollisionShape *pbVar2;
  btCollisionObject *in_RSI;
  btCollisionObject *in_RDI;
  CollideVF_SS docollide_1;
  CollideCL_SS docollide;
  int cf;
  ICollide *in_stack_000000f8;
  btDbvtNode *in_stack_00000100;
  btDbvtNode *in_stack_00000108;
  btDbvt *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  btSoftBody *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  
  uVar1 = (uint)in_RDI[1].m_interpolationLinearVelocity.m_floats[1] &
          (uint)in_RSI[1].m_interpolationLinearVelocity.m_floats[1] & 0x30;
  if (uVar1 == 0x10) {
    if (in_RDI != in_RSI) {
      btSoftColliders::CollideVF_SS::CollideVF_SS
                ((CollideVF_SS *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      pbVar2 = btCollisionObject::getCollisionShape(in_RDI);
      (*pbVar2->_vptr_btCollisionShape[0xc])();
      pbVar2 = btCollisionObject::getCollisionShape(in_RSI);
      (*pbVar2->_vptr_btCollisionShape[0xc])();
      btDbvt::collideTT(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8);
      btDbvt::collideTT(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8);
      btSoftColliders::CollideVF_SS::~CollideVF_SS((CollideVF_SS *)0x27c90c);
    }
  }
  else if ((uVar1 == 0x20) &&
          ((in_RDI != in_RSI ||
           (((uint)in_RSI[1].m_interpolationLinearVelocity.m_floats[1] & 0x40) != 0)))) {
    btSoftColliders::CollideCL_SS::CollideCL_SS
              ((CollideCL_SS *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    btSoftColliders::CollideCL_SS::ProcessSoftSoft
              ((CollideCL_SS *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,
               (btSoftBody *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    btSoftColliders::CollideCL_SS::~CollideCL_SS((CollideCL_SS *)0x27c7d0);
  }
  return;
}

Assistant:

void			btSoftBody::defaultCollisionHandler(btSoftBody* psb)
{
	const int cf=m_cfg.collisions&psb->m_cfg.collisions;
	switch(cf&fCollision::SVSmask)
	{
	case	fCollision::CL_SS:
		{
			
			//support self-collision if CL_SELF flag set
			if (this!=psb || psb->m_cfg.collisions&fCollision::CL_SELF)
			{
				btSoftColliders::CollideCL_SS	docollide;
				docollide.ProcessSoftSoft(this,psb);
			}
			
		}
		break;
	case	fCollision::VF_SS:
		{
			//only self-collision for Cluster, not Vertex-Face yet
			if (this!=psb)
			{
				btSoftColliders::CollideVF_SS	docollide;
				/* common					*/ 
				docollide.mrg=	getCollisionShape()->getMargin()+
					psb->getCollisionShape()->getMargin();
				/* psb0 nodes vs psb1 faces	*/ 
				docollide.psb[0]=this;
				docollide.psb[1]=psb;
				docollide.psb[0]->m_ndbvt.collideTT(	docollide.psb[0]->m_ndbvt.m_root,
					docollide.psb[1]->m_fdbvt.m_root,
					docollide);
				/* psb1 nodes vs psb0 faces	*/ 
				docollide.psb[0]=psb;
				docollide.psb[1]=this;
				docollide.psb[0]->m_ndbvt.collideTT(	docollide.psb[0]->m_ndbvt.m_root,
					docollide.psb[1]->m_fdbvt.m_root,
					docollide);
			}
		}
		break;
	default:
		{
			
		}
	}
}